

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O3

void __thiscall icu_63::LocaleDisplayNamesImpl::initialize(LocaleDisplayNamesImpl *this)

{
  ICUDataTable *this_00;
  Locale *this_01;
  UnicodeString *this_02;
  short sVar1;
  bool bVar2;
  UBool UVar3;
  int32_t iVar4;
  UDisplayContext UVar5;
  Locale *pLVar6;
  BreakIterator *pBVar7;
  bool bVar8;
  UErrorCode status;
  LocalUResourceBundlePointer resource;
  UnicodeString ktPattern;
  UnicodeString pattern;
  CapitalizationContextSink sink;
  UnicodeString sep;
  UErrorCode local_13c;
  LocalUResourceBundlePointer local_138;
  UnicodeString local_130;
  UnicodeString local_f0;
  UnicodeString local_b0;
  UnicodeString local_70;
  
  this_00 = &this->langData;
  this_01 = &(this->langData).locale;
  pLVar6 = Locale::getRoot();
  UVar3 = Locale::operator==(this_01,pLVar6);
  pLVar6 = &(this->regionData).locale;
  if (UVar3 == '\0') {
    pLVar6 = this_01;
  }
  Locale::operator=(&this->locale,pLVar6);
  local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b2258;
  local_70.fUnion.fStackFields.fLengthAndFlags = 2;
  ICUDataTable::getNoFallback(this_00,"localeDisplayPattern",(char *)0x0,"separator",&local_70);
  if ((local_70.fUnion.fStackFields.fLengthAndFlags & 1U) != 0) {
    UnicodeString::UnicodeString(&local_f0,"{0}, {1}",-1,kInvariant);
    UnicodeString::moveFrom(&local_70,&local_f0);
    UnicodeString::~UnicodeString(&local_f0);
  }
  local_13c = U_ZERO_ERROR;
  SimpleFormatter::applyPatternMinMaxArguments(&this->separatorFormat,&local_70,2,2,&local_13c);
  local_f0.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b2258;
  local_f0.fUnion.fStackFields.fLengthAndFlags = 2;
  ICUDataTable::getNoFallback(this_00,"localeDisplayPattern",(char *)0x0,"pattern",&local_f0);
  if ((local_f0.fUnion.fStackFields.fLengthAndFlags & 1U) != 0) {
    UnicodeString::UnicodeString(&local_130,"{0} ({1})",-1,kInvariant);
    UnicodeString::moveFrom(&local_f0,&local_130);
    UnicodeString::~UnicodeString(&local_130);
  }
  SimpleFormatter::applyPatternMinMaxArguments(&this->format,&local_f0,2,2,&local_13c);
  if (-1 < local_f0.fUnion.fStackFields.fLengthAndFlags) {
    local_f0.fUnion.fFields.fLength = (int)local_f0.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  iVar4 = UnicodeString::doIndexOf(&local_f0,L'（',0,local_f0.fUnion.fFields.fLength);
  this_02 = &this->formatOpenParen;
  if (iVar4 < 0) {
    local_130.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x28;
    UnicodeString::unBogus(this_02);
    sVar1 = (this->formatOpenParen).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar4 = (this->formatOpenParen).fUnion.fFields.fLength;
    }
    else {
      iVar4 = (int)sVar1 >> 5;
    }
    UnicodeString::doReplace(this_02,0,iVar4,(UChar *)&local_130,0,1);
    local_130.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x5b;
    UnicodeString::unBogus(&this->formatReplaceOpenParen);
    sVar1 = (this->formatReplaceOpenParen).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar4 = (this->formatReplaceOpenParen).fUnion.fFields.fLength;
    }
    else {
      iVar4 = (int)sVar1 >> 5;
    }
    UnicodeString::doReplace(&this->formatReplaceOpenParen,0,iVar4,(UChar *)&local_130,0,1);
    local_130.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x29;
    UnicodeString::unBogus(&this->formatCloseParen);
    sVar1 = (this->formatCloseParen).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar4 = (this->formatCloseParen).fUnion.fFields.fLength;
    }
    else {
      iVar4 = (int)sVar1 >> 5;
    }
    UnicodeString::doReplace(&this->formatCloseParen,0,iVar4,(UChar *)&local_130,0,1);
    local_130.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0x5d;
    UnicodeString::unBogus(&this->formatReplaceCloseParen);
    sVar1 = (this->formatReplaceCloseParen).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar4 = (this->formatReplaceCloseParen).fUnion.fFields.fLength;
    }
    else {
      iVar4 = (int)sVar1 >> 5;
    }
    UnicodeString::doReplace(&this->formatReplaceCloseParen,0,iVar4,(UChar *)&local_130,0,1);
  }
  else {
    local_130.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0xff08;
    UnicodeString::unBogus(this_02);
    sVar1 = (this->formatOpenParen).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar4 = (this->formatOpenParen).fUnion.fFields.fLength;
    }
    else {
      iVar4 = (int)sVar1 >> 5;
    }
    UnicodeString::doReplace(this_02,0,iVar4,(UChar *)&local_130,0,1);
    local_130.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0xff3b;
    UnicodeString::unBogus(&this->formatReplaceOpenParen);
    sVar1 = (this->formatReplaceOpenParen).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar4 = (this->formatReplaceOpenParen).fUnion.fFields.fLength;
    }
    else {
      iVar4 = (int)sVar1 >> 5;
    }
    UnicodeString::doReplace(&this->formatReplaceOpenParen,0,iVar4,(UChar *)&local_130,0,1);
    local_130.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0xff09;
    UnicodeString::unBogus(&this->formatCloseParen);
    sVar1 = (this->formatCloseParen).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar4 = (this->formatCloseParen).fUnion.fFields.fLength;
    }
    else {
      iVar4 = (int)sVar1 >> 5;
    }
    UnicodeString::doReplace(&this->formatCloseParen,0,iVar4,(UChar *)&local_130,0,1);
    local_130.super_Replaceable.super_UObject._vptr_UObject._0_2_ = 0xff3d;
    UnicodeString::unBogus(&this->formatReplaceCloseParen);
    sVar1 = (this->formatReplaceCloseParen).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar4 = (this->formatReplaceCloseParen).fUnion.fFields.fLength;
    }
    else {
      iVar4 = (int)sVar1 >> 5;
    }
    UnicodeString::doReplace(&this->formatReplaceCloseParen,0,iVar4,(UChar *)&local_130,0,1);
  }
  local_130.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b2258;
  local_130.fUnion.fStackFields.fLengthAndFlags = 2;
  ICUDataTable::get(this_00,"localeDisplayPattern",(char *)0x0,"keyTypePattern",&local_130);
  if ((local_130.fUnion.fStackFields.fLengthAndFlags & 1U) != 0) {
    UnicodeString::UnicodeString(&local_b0,"{0}={1}",-1,kInvariant);
    UnicodeString::moveFrom(&local_130,&local_b0);
    UnicodeString::~UnicodeString(&local_b0);
  }
  SimpleFormatter::applyPatternMinMaxArguments(&this->keyTypeFormat,&local_130,2,2,&local_13c);
  this->fCapitalization[4] = '\0';
  this->fCapitalization[5] = '\0';
  this->fCapitalization[0] = '\0';
  this->fCapitalization[1] = '\0';
  this->fCapitalization[2] = '\0';
  this->fCapitalization[3] = '\0';
  UVar5 = this->capitalizationContext;
  if (UVar5 - UDISPCTX_CAPITALIZATION_FOR_UI_LIST_OR_MENU < 2) {
    local_138.super_LocalPointerBase<UResourceBundle>.ptr =
         (LocalPointerBase<UResourceBundle>)
         ures_open_63((char *)0x0,(this->locale).fullName,&local_13c);
    if (U_ZERO_ERROR < local_13c) {
      LocalUResourceBundlePointer::~LocalUResourceBundlePointer(&local_138);
      goto LAB_002823c4;
    }
    local_b0.super_Replaceable.super_UObject._vptr_UObject =
         (UObject)&PTR__CapitalizationContextSink_003aac98;
    local_b0.fUnion.fStackFields.fLengthAndFlags._0_1_ = '\0';
    local_b0.fUnion._8_8_ = this;
    ures_getAllItemsWithFallback_63
              ((UResourceBundle *)local_138.super_LocalPointerBase<UResourceBundle>.ptr,
               "contextTransforms",(ResourceSink *)&local_b0,&local_13c);
    if (local_13c == U_MISSING_RESOURCE_ERROR) {
      local_13c = U_ZERO_ERROR;
LAB_0028238e:
      bVar8 = local_b0.fUnion.fStackFields.fLengthAndFlags._0_1_ != '\0';
      bVar2 = true;
    }
    else {
      if (local_13c < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_0028238e;
      bVar8 = false;
      bVar2 = false;
    }
    ResourceSink::~ResourceSink((ResourceSink *)&local_b0);
    LocalUResourceBundlePointer::~LocalUResourceBundlePointer(&local_138);
    if (!bVar2) goto LAB_002823c4;
    UVar5 = this->capitalizationContext;
  }
  else {
    bVar8 = false;
  }
  if ((bVar8) || (UVar5 == UDISPCTX_CAPITALIZATION_FOR_BEGINNING_OF_SENTENCE)) {
    local_13c = U_ZERO_ERROR;
    pBVar7 = BreakIterator::createSentenceInstance(&this->locale,&local_13c);
    this->capitalizationBrkIter = pBVar7;
    if (U_ZERO_ERROR < local_13c) {
      if (pBVar7 != (BreakIterator *)0x0) {
        (*(pBVar7->super_UObject)._vptr_UObject[1])(pBVar7);
      }
      this->capitalizationBrkIter = (BreakIterator *)0x0;
    }
  }
LAB_002823c4:
  UnicodeString::~UnicodeString(&local_130);
  UnicodeString::~UnicodeString(&local_f0);
  UnicodeString::~UnicodeString(&local_70);
  return;
}

Assistant:

void
LocaleDisplayNamesImpl::initialize(void) {
    LocaleDisplayNamesImpl *nonConstThis = (LocaleDisplayNamesImpl *)this;
    nonConstThis->locale = langData.getLocale() == Locale::getRoot()
        ? regionData.getLocale()
        : langData.getLocale();

    UnicodeString sep;
    langData.getNoFallback("localeDisplayPattern", "separator", sep);
    if (sep.isBogus()) {
        sep = UnicodeString("{0}, {1}", -1, US_INV);
    }
    UErrorCode status = U_ZERO_ERROR;
    separatorFormat.applyPatternMinMaxArguments(sep, 2, 2, status);

    UnicodeString pattern;
    langData.getNoFallback("localeDisplayPattern", "pattern", pattern);
    if (pattern.isBogus()) {
        pattern = UnicodeString("{0} ({1})", -1, US_INV);
    }
    format.applyPatternMinMaxArguments(pattern, 2, 2, status);
    if (pattern.indexOf((UChar)0xFF08) >= 0) {
        formatOpenParen.setTo((UChar)0xFF08);         // fullwidth (
        formatReplaceOpenParen.setTo((UChar)0xFF3B);  // fullwidth [
        formatCloseParen.setTo((UChar)0xFF09);        // fullwidth )
        formatReplaceCloseParen.setTo((UChar)0xFF3D); // fullwidth ]
    } else {
        formatOpenParen.setTo((UChar)0x0028);         // (
        formatReplaceOpenParen.setTo((UChar)0x005B);  // [
        formatCloseParen.setTo((UChar)0x0029);        // )
        formatReplaceCloseParen.setTo((UChar)0x005D); // ]
    }

    UnicodeString ktPattern;
    langData.get("localeDisplayPattern", "keyTypePattern", ktPattern);
    if (ktPattern.isBogus()) {
        ktPattern = UnicodeString("{0}={1}", -1, US_INV);
    }
    keyTypeFormat.applyPatternMinMaxArguments(ktPattern, 2, 2, status);

    uprv_memset(fCapitalization, 0, sizeof(fCapitalization));
#if !UCONFIG_NO_BREAK_ITERATION
    // Only get the context data if we need it! This is a const object so we know now...
    // Also check whether we will need a break iterator (depends on the data)
    UBool needBrkIter = FALSE;
    if (capitalizationContext == UDISPCTX_CAPITALIZATION_FOR_UI_LIST_OR_MENU || capitalizationContext == UDISPCTX_CAPITALIZATION_FOR_STANDALONE) {
        LocalUResourceBundlePointer resource(ures_open(NULL, locale.getName(), &status));
        if (U_FAILURE(status)) { return; }
        CapitalizationContextSink sink(*this);
        ures_getAllItemsWithFallback(resource.getAlias(), "contextTransforms", sink, status);
        if (status == U_MISSING_RESOURCE_ERROR) {
            // Silently ignore.  Not every locale has contextTransforms.
            status = U_ZERO_ERROR;
        } else if (U_FAILURE(status)) {
            return;
        }
        needBrkIter = sink.hasCapitalizationUsage;
    }
    // Get a sentence break iterator if we will need it
    if (needBrkIter || capitalizationContext == UDISPCTX_CAPITALIZATION_FOR_BEGINNING_OF_SENTENCE) {
        status = U_ZERO_ERROR;
        capitalizationBrkIter = BreakIterator::createSentenceInstance(locale, status);
        if (U_FAILURE(status)) {
            delete capitalizationBrkIter;
            capitalizationBrkIter = NULL;
        }
    }
#endif
}